

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int set_gf_interval_update_onepass_rt(AV1_COMP *cpi,FRAME_TYPE frame_type)

{
  int iVar1;
  AV1_COMP *in_RDI;
  int resize_pending;
  int gf_update;
  RATE_CONTROL *rc;
  int local_1c;
  
  local_1c = 0;
  iVar1 = is_frame_resize_pending(in_RDI);
  if ((((iVar1 != 0) || ((in_RDI->rc).high_source_sad != 0)) ||
      ((in_RDI->rc).frames_till_gf_update_due == 0)) &&
     (((in_RDI->svc).temporal_layer_id == 0 && ((in_RDI->svc).spatial_layer_id == 0)))) {
    set_baseline_gf_interval((AV1_COMP *)rc,gf_update._3_1_);
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

static int set_gf_interval_update_onepass_rt(AV1_COMP *cpi,
                                             FRAME_TYPE frame_type) {
  RATE_CONTROL *const rc = &cpi->rc;
  int gf_update = 0;
  const int resize_pending = is_frame_resize_pending(cpi);
  // GF update based on frames_till_gf_update_due, also
  // force update on resize pending frame or for scene change.
  if ((resize_pending || rc->high_source_sad ||
       rc->frames_till_gf_update_due == 0) &&
      cpi->svc.temporal_layer_id == 0 && cpi->svc.spatial_layer_id == 0) {
    set_baseline_gf_interval(cpi, frame_type);
    gf_update = 1;
  }
  return gf_update;
}